

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O1

FT_UInt pfr_cmap_char_index(PFR_CMap cmap,FT_UInt32 char_code)

{
  uint uVar1;
  FT_UInt in_EAX;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = cmap->num_chars;
  uVar4 = 0;
  do {
    if (uVar2 < uVar4 || uVar2 - uVar4 == 0) {
      return 0;
    }
    uVar3 = (uVar2 - uVar4 >> 1) + uVar4;
    uVar1 = cmap->chars[uVar3].char_code;
    if (uVar1 == char_code) {
      in_EAX = uVar3 + 1;
      uVar3 = uVar2;
    }
    else if (uVar1 < char_code) {
      uVar4 = uVar3 + 1;
      uVar3 = uVar2;
    }
    uVar2 = uVar3;
  } while (uVar1 != char_code);
  return in_EAX;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pfr_cmap_char_index( PFR_CMap   cmap,
                       FT_UInt32  char_code )
  {
    FT_UInt  min = 0;
    FT_UInt  max = cmap->num_chars;


    while ( min < max )
    {
      PFR_Char  gchar;
      FT_UInt   mid;


      mid   = min + ( max - min ) / 2;
      gchar = cmap->chars + mid;

      if ( gchar->char_code == char_code )
        return mid + 1;

      if ( gchar->char_code < char_code )
        min = mid + 1;
      else
        max = mid;
    }
    return 0;
  }